

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
          (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *this,
          small_vector<int,_4UL,_0UL,_std::allocator<int>_> *v,allocator<int> *alloc)

{
  size_t sVar1;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *in_RSI;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *in_RDI;
  pointer p;
  allocator<int> *in_stack_ffffffffffffffb8;
  allocator<int> *in_stack_ffffffffffffffc0;
  pointer local_30;
  
  std::allocator<int>::allocator(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  in_RDI->m_dynamic_capacity = 0;
  in_RDI->m_dynamic_data = (pointer)0x0;
  sVar1 = size(in_RSI);
  if (sVar1 < 5) {
    in_stack_ffffffffffffffb8 = (allocator<int> *)static_begin_ptr(in_RDI);
    in_RDI->m_end = (pointer)in_stack_ffffffffffffffb8;
    in_RDI->m_begin = (pointer)in_stack_ffffffffffffffb8;
    in_RDI->m_capacity = 4;
  }
  else {
    sVar1 = size(in_RSI);
    in_RDI->m_dynamic_capacity = sVar1;
    get_alloc(in_RDI);
    in_stack_ffffffffffffffc0 =
         (allocator<int> *)
         std::allocator_traits<std::allocator<int>_>::allocate
                   (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
    in_RDI->m_dynamic_data = (pointer)in_stack_ffffffffffffffc0;
    in_RDI->m_end = (pointer)in_stack_ffffffffffffffc0;
    in_RDI->m_begin = (pointer)in_stack_ffffffffffffffc0;
    sVar1 = size(in_RSI);
    in_RDI->m_capacity = sVar1;
  }
  for (local_30 = in_RSI->m_begin; local_30 != in_RSI->m_end; local_30 = local_30 + 1) {
    get_alloc(in_RDI);
    std::allocator_traits<std::allocator<int>>::construct<int,int&>
              (in_stack_ffffffffffffffc0,(int *)in_stack_ffffffffffffffb8,(int *)0x143cde);
    in_RDI->m_end = in_RDI->m_end + 1;
  }
  return;
}

Assistant:

small_vector(const small_vector& v, const Alloc& alloc)
        : m_alloc(alloc)
        , m_dynamic_capacity(0)
        , m_dynamic_data(nullptr)
    {
        if (v.size() > StaticCapacity)
        {
            m_dynamic_capacity = v.size();
            m_begin = m_end = m_dynamic_data = atraits::allocate(get_alloc(), m_dynamic_capacity);
            m_capacity = v.size();
        }
        else
        {
            m_begin = m_end = static_begin_ptr();
            m_capacity = StaticCapacity;
        }

        for (auto p = v.m_begin; p != v.m_end; ++p)
        {
            atraits::construct(get_alloc(), m_end, *p);
            ++m_end;
        }
    }